

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O2

void __thiscall moira::Moira::reset<(moira::Core)2>(Moira *this)

{
  uint uVar1;
  int iVar2;
  
  this->flags = 0x40;
  (this->reg).pc = 0;
  (this->reg).pc0 = 0;
  (this->reg).sr.t1 = false;
  (this->reg).sr.t0 = false;
  (this->reg).sr.s = false;
  (this->reg).sr.m = false;
  (this->reg).sr.x = false;
  (this->reg).sr.n = false;
  (this->reg).sr.z = false;
  (this->reg).sr.v = false;
  *(undefined8 *)&(this->reg).sr.c = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 4) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0xc) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x14) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x1c) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x24) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x2c) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x34) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x3c) = 0;
  (this->reg).isp = 0;
  (this->reg).msp = 0;
  (this->reg).ipl = '\0';
  *(undefined3 *)&(this->reg).field_0x61 = 0;
  (this->reg).vbr = 0;
  (this->reg).sfc = 0;
  (this->reg).dfc = 0;
  (this->reg).cacr = 0;
  (this->reg).caar = 0;
  (this->reg).sr.s = true;
  (this->reg).sr.ipl = '\a';
  this->ipl = '\0';
  this->fcl = '\x02';
  this->fcSource = '\0';
  uVar1 = (*this->_vptr_Moira[5])(this,0);
  (this->reg).field_3.field_0.a[7] = uVar1 & 0xffff;
  uVar1 = (*this->_vptr_Moira[5])(this,2);
  uVar1 = (this->reg).field_3.field_0.a[7] << 0x10 | uVar1 & 0xfffe;
  (this->reg).field_3.field_0.a[7] = uVar1;
  (this->reg).isp = uVar1;
  uVar1 = (*this->_vptr_Moira[5])(this,4);
  (this->reg).pc = uVar1 & 0xffff;
  uVar1 = (*this->_vptr_Moira[5])(this,6);
  uVar1 = (this->reg).pc << 0x10 | uVar1 & 0xfffe;
  (this->reg).pc = uVar1;
  iVar2 = (*this->_vptr_Moira[5])
                    (this,(ulong)((uint)(this->cpuModel == M68EC020) * 0x1000000 - 2 & uVar1));
  (this->queue).irc = (u16)iVar2;
  prefetch<(moira::Core)2,0ull>(this);
  Debugger::reset(&this->debugger);
  (*this->_vptr_Moira[10])(this);
  return;
}

Assistant:

void
Moira::reset()
{
    flags = State::CHECK_IRQ;

    reg = { };
    reg.sr.s = 1;
    reg.sr.ipl = 7;

    ipl = 0;
    fcl = 2;
    fcSource = 0;

    SYNC(16);

    // Read the initial (supervisor) stack pointer from memory
    SYNC(2);
    reg.sp = read16OnReset(0);
    SYNC(4);
    reg.isp = reg.sp = (read16OnReset(2) & ~0x1) | reg.sp << 16;
    SYNC(4);
    reg.pc = read16OnReset(4);
    SYNC(4);
    reg.pc = (read16OnReset(6) & ~0x1) | reg.pc << 16;

    // Fill the prefetch queue
    SYNC(4);
    queue.irc = read16OnReset(reg.pc & addrMask<C>());
    SYNC(2);
    prefetch<C>();

    // Reset subcomponents
    debugger.reset();

    // Inform the delegate
    cpuDidReset();
}